

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O0

REF_STATUS
moving_fixed_point_metric
          (REF_DBL *metric,REF_GRID_conflict ref_grid,REF_INT first_timestep,REF_INT last_timestep,
          REF_INT timestep_increment,char *in_project,char *solb_middle,
          REF_RECON_RECONSTRUCTION reconstruction,REF_INT p,REF_DBL gradation,REF_DBL complexity)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  double local_518;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  int local_4d0;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT j;
  REF_INT i;
  REF_DBL *displaced;
  int local_4b8;
  REF_INT fixed_point_ldim;
  REF_INT node;
  REF_INT im;
  REF_DBL inv_total;
  char solb_filename [1024];
  int local_a0;
  uint local_9c;
  REF_INT total_timesteps;
  REF_INT timestep;
  REF_DBL det;
  REF_DBL *xyz;
  REF_DBL *this_metric;
  REF_DBL *grad;
  REF_DBL *x;
  REF_DBL *jac;
  REF_DBL *scalar;
  REF_DBL *hess;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  REF_DBL complexity_local;
  REF_DBL gradation_local;
  char *in_project_local;
  REF_INT local_28;
  REF_INT timestep_increment_local;
  REF_INT last_timestep_local;
  REF_INT first_timestep_local;
  REF_GRID_conflict ref_grid_local;
  REF_DBL *metric_local;
  
  ref_node = (REF_NODE)ref_grid->mpi;
  hess = (REF_DBL *)ref_grid->node;
  ref_mpi = (REF_MPI)complexity;
  complexity_local = gradation;
  gradation_local = (REF_DBL)in_project;
  in_project_local._4_4_ = timestep_increment;
  local_28 = last_timestep;
  timestep_increment_local = first_timestep;
  _last_timestep_local = ref_grid;
  ref_grid_local = (REF_GRID_conflict)metric;
  if (((REF_NODE)hess)->max * 6 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0xb2f,"moving_fixed_point_metric","malloc hess of REF_DBL negative");
    metric_local._4_4_ = 1;
  }
  else {
    scalar = (REF_DBL *)malloc((long)(((REF_NODE)hess)->max * 6) << 3);
    if (scalar == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0xb2f,"moving_fixed_point_metric","malloc hess of REF_DBL NULL");
      metric_local._4_4_ = 2;
    }
    else if (*(int *)((long)hess + 4) * 6 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0xb30,"moving_fixed_point_metric","malloc this_metric of REF_DBL negative");
      metric_local._4_4_ = 1;
    }
    else {
      xyz = (REF_DBL *)malloc((long)(*(int *)((long)hess + 4) * 6) << 3);
      if (xyz == (REF_DBL *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0xb30,"moving_fixed_point_metric","malloc this_metric of REF_DBL NULL");
        metric_local._4_4_ = 2;
      }
      else if (*(int *)((long)hess + 4) * 9 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0xb31,"moving_fixed_point_metric","malloc jac of REF_DBL negative");
        metric_local._4_4_ = 1;
      }
      else {
        x = (REF_DBL *)malloc((long)(*(int *)((long)hess + 4) * 9) << 3);
        if (x == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0xb31,"moving_fixed_point_metric","malloc jac of REF_DBL NULL");
          metric_local._4_4_ = 2;
        }
        else if (*(int *)((long)hess + 4) < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0xb32,"moving_fixed_point_metric","malloc x of REF_DBL negative");
          metric_local._4_4_ = 1;
        }
        else {
          grad = (REF_DBL *)malloc((long)*(int *)((long)hess + 4) << 3);
          if (grad == (REF_DBL *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0xb32,"moving_fixed_point_metric","malloc x of REF_DBL NULL");
            metric_local._4_4_ = 2;
          }
          else if (*(int *)((long)hess + 4) * 3 < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0xb33,"moving_fixed_point_metric","malloc grad of REF_DBL negative");
            metric_local._4_4_ = 1;
          }
          else {
            this_metric = (REF_DBL *)malloc((long)(*(int *)((long)hess + 4) * 3) << 3);
            if (this_metric == (REF_DBL *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0xb33,"moving_fixed_point_metric","malloc grad of REF_DBL NULL");
              metric_local._4_4_ = 2;
            }
            else if (*(int *)((long)hess + 4) * 3 < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0xb34,"moving_fixed_point_metric","malloc xyz of REF_DBL negative");
              metric_local._4_4_ = 1;
            }
            else {
              det = (REF_DBL)malloc((long)(*(int *)((long)hess + 4) * 3) << 3);
              if ((void *)det == (void *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                       ,0xb34,"moving_fixed_point_metric","malloc xyz of REF_DBL NULL");
                metric_local._4_4_ = 2;
              }
              else {
                local_a0 = 0;
                for (local_9c = timestep_increment_local; (int)local_9c <= local_28;
                    local_9c = in_project_local._4_4_ + local_9c) {
                  snprintf((char *)&inv_total,0x400,"%s%s%d.solb",gradation_local,solb_middle,
                           (ulong)local_9c);
                  if (ref_node->max == 0) {
                    printf("read and hess recon for %s\n",&inv_total);
                  }
                  uVar1 = ref_part_scalar(_last_timestep_local,(REF_INT *)((long)&displaced + 4),
                                          &jac,(char *)&inv_total);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                           ,0xb3e,"moving_fixed_point_metric",(ulong)uVar1,"unable to load scalar");
                    return uVar1;
                  }
                  if ((long)displaced._4_4_ != 4) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                           ,0xb3f,"moving_fixed_point_metric","expected x,y,z and one scalar",4,
                           (long)displaced._4_4_);
                    return 1;
                  }
                  uVar1 = extract_displaced_xyz
                                    ((REF_NODE)hess,(REF_INT *)((long)&displaced + 4),&jac,
                                     (REF_DBL **)&j);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                           ,0xb41,"moving_fixed_point_metric",(ulong)uVar1,"disp");
                    return uVar1;
                  }
                  if (_last_timestep_local->twod != 0) {
                    for (local_4b8 = 0; local_4b8 < *(int *)((long)hess + 4);
                        local_4b8 = local_4b8 + 1) {
                      if (((-1 < local_4b8) && (local_4b8 < *(int *)((long)hess + 4))) &&
                         (-1 < *(long *)((long)hess[2] + (long)local_4b8 * 8))) {
                        _j[local_4b8 * 3 + 1] = _j[local_4b8 * 3 + 2];
                        _j[local_4b8 * 3 + 2] = 0.0;
                      }
                    }
                  }
                  for (local_4d0 = 0; local_4d0 < 3; local_4d0 = local_4d0 + 1) {
                    for (local_4b8 = 0; local_4b8 < *(int *)((long)hess + 4);
                        local_4b8 = local_4b8 + 1) {
                      if (((-1 < local_4b8) && (local_4b8 < *(int *)((long)hess + 4))) &&
                         (-1 < *(long *)((long)hess[2] + (long)local_4b8 * 8))) {
                        grad[local_4b8] = _j[local_4d0 + local_4b8 * 3];
                      }
                    }
                    uVar1 = ref_recon_gradient(_last_timestep_local,grad,this_metric,reconstruction)
                    ;
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                             ,0xb4c,"moving_fixed_point_metric",(ulong)uVar1,"recon x");
                      return uVar1;
                    }
                    if (_last_timestep_local->twod != 0) {
                      for (local_4b8 = 0; local_4b8 < *(int *)((long)hess + 4);
                          local_4b8 = local_4b8 + 1) {
                        if (((-1 < local_4b8) && (local_4b8 < *(int *)((long)hess + 4))) &&
                           (-1 < *(long *)((long)hess[2] + (long)local_4b8 * 8))) {
                          this_metric[local_4b8 * 3 + 2] = 1.0;
                        }
                      }
                    }
                    for (local_4b8 = 0; local_4b8 < *(int *)((long)hess + 4);
                        local_4b8 = local_4b8 + 1) {
                      if (((-1 < local_4b8) && (local_4b8 < *(int *)((long)hess + 4))) &&
                         (-1 < *(long *)((long)hess[2] + (long)local_4b8 * 8))) {
                        for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 3;
                            ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                          x[ref_private_macro_code_rss + local_4d0 * 3 + local_4b8 * 9] =
                               this_metric[ref_private_macro_code_rss + local_4b8 * 3];
                        }
                      }
                    }
                  }
                  for (local_4b8 = 0; local_4b8 < *(int *)((long)hess + 4);
                      local_4b8 = local_4b8 + 1) {
                    if (((-1 < local_4b8) && (local_4b8 < *(int *)((long)hess + 4))) &&
                       (-1 < *(long *)((long)hess[2] + (long)local_4b8 * 8))) {
                      for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 3;
                          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                        *(undefined8 *)
                         ((long)det + (long)(ref_private_macro_code_rss + local_4b8 * 3) * 8) =
                             *(undefined8 *)
                              ((long)hess[7] +
                              (long)(ref_private_macro_code_rss + local_4b8 * 0xf) * 8);
                        *(REF_DBL *)
                         ((long)hess[7] + (long)(ref_private_macro_code_rss + local_4b8 * 0xf) * 8)
                             = _j[ref_private_macro_code_rss + local_4b8 * 3];
                      }
                    }
                  }
                  uVar1 = ref_recon_hessian(_last_timestep_local,jac,scalar,reconstruction);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                           ,0xb5d,"moving_fixed_point_metric",(ulong)uVar1,"hess");
                    return uVar1;
                  }
                  uVar1 = ref_recon_roundoff_limit(scalar,_last_timestep_local);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                           ,0xb5f,"moving_fixed_point_metric",(ulong)uVar1,
                           "floor metric eigenvalues based on grid size and solution jitter");
                    return uVar1;
                  }
                  for (local_4b8 = 0; local_4b8 < *(int *)((long)hess + 4);
                      local_4b8 = local_4b8 + 1) {
                    if (((-1 < local_4b8) && (local_4b8 < *(int *)((long)hess + 4))) &&
                       (-1 < *(long *)((long)hess[2] + (long)local_4b8 * 8))) {
                      for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 3;
                          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                        *(undefined8 *)
                         ((long)hess[7] + (long)(ref_private_macro_code_rss + local_4b8 * 0xf) * 8)
                             = *(undefined8 *)
                                ((long)det + (long)(ref_private_macro_code_rss + local_4b8 * 3) * 8)
                        ;
                      }
                    }
                  }
                  for (local_4b8 = 0; local_4b8 < *(int *)((long)hess + 4);
                      local_4b8 = local_4b8 + 1) {
                    if (((-1 < local_4b8) && (local_4b8 < *(int *)((long)hess + 4))) &&
                       (-1 < *(long *)((long)hess[2] + (long)local_4b8 * 8))) {
                      uVar1 = ref_matrix_jac_m_jact
                                        (x + local_4b8 * 9,scalar + local_4b8 * 6,
                                         xyz + local_4b8 * 6);
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                               ,0xb69,"moving_fixed_point_metric",(ulong)uVar1,"J M J^t");
                        return uVar1;
                      }
                      uVar1 = ref_matrix_det_gen(3,x + local_4b8 * 9,(REF_DBL *)&total_timesteps);
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                               ,0xb6b,"moving_fixed_point_metric",(ulong)uVar1,"gen det");
                        return uVar1;
                      }
                      for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 6;
                          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                        if (_total_timesteps <= 0.0) {
                          local_518 = -_total_timesteps;
                        }
                        else {
                          local_518 = _total_timesteps;
                        }
                        dVar4 = pow(local_518,1.0 / (double)p);
                        iVar2 = ref_private_macro_code_rss + local_4b8 * 6;
                        xyz[iVar2] = dVar4 * xyz[iVar2];
                      }
                    }
                  }
                  local_a0 = local_a0 + 1;
                  for (local_4b8 = 0; local_4b8 < *(int *)((long)hess + 4);
                      local_4b8 = local_4b8 + 1) {
                    if (((-1 < local_4b8) && (local_4b8 < *(int *)((long)hess + 4))) &&
                       (-1 < *(long *)((long)hess[2] + (long)local_4b8 * 8))) {
                      for (fixed_point_ldim = 0; fixed_point_ldim < 6;
                          fixed_point_ldim = fixed_point_ldim + 1) {
                        lVar3 = (long)(fixed_point_ldim + local_4b8 * 6);
                        ref_grid_local->cell[lVar3 + -2] =
                             (REF_CELL)
                             (xyz[fixed_point_ldim + local_4b8 * 6] +
                             (double)ref_grid_local->cell[lVar3 + -2]);
                      }
                    }
                  }
                  if (_j != (REF_DBL *)0x0) {
                    free(_j);
                  }
                  if (jac != (REF_DBL *)0x0) {
                    free(jac);
                  }
                }
                free((void *)det);
                free(this_metric);
                free(grad);
                free(x);
                free(xyz);
                free(scalar);
                ref_mpi_stopwatch_stop((REF_MPI)ref_node,"all timesteps processed");
                if (local_a0 < 1) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                         ,0xb83,"moving_fixed_point_metric","expected one or more timesteps");
                  metric_local._4_4_ = 1;
                }
                else {
                  _node = 1.0 / (double)local_a0;
                  for (local_4b8 = 0; local_4b8 < *(int *)((long)hess + 4);
                      local_4b8 = local_4b8 + 1) {
                    if (((-1 < local_4b8) && (local_4b8 < *(int *)((long)hess + 4))) &&
                       (-1 < *(long *)((long)hess[2] + (long)local_4b8 * 8))) {
                      for (fixed_point_ldim = 0; fixed_point_ldim < 6;
                          fixed_point_ldim = fixed_point_ldim + 1) {
                        lVar3 = (long)(fixed_point_ldim + local_4b8 * 6);
                        ref_grid_local->cell[lVar3 + -2] =
                             (REF_CELL)(_node * (double)ref_grid_local->cell[lVar3 + -2]);
                      }
                    }
                  }
                  uVar1 = ref_recon_roundoff_limit((REF_DBL *)ref_grid_local,_last_timestep_local);
                  if (uVar1 == 0) {
                    uVar1 = ref_metric_local_scale((REF_DBL *)ref_grid_local,_last_timestep_local,p)
                    ;
                    if (uVar1 == 0) {
                      ref_mpi_stopwatch_stop((REF_MPI)ref_node,"local scale metric");
                      uVar1 = ref_metric_gradation_at_complexity
                                        ((REF_DBL *)ref_grid_local,_last_timestep_local,
                                         complexity_local,(REF_DBL)ref_mpi);
                      if (uVar1 == 0) {
                        ref_mpi_stopwatch_stop((REF_MPI)ref_node,"metric gradation and complexity");
                        metric_local._4_4_ = 0;
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                               ,0xb90,"moving_fixed_point_metric",(ulong)uVar1,
                               "gradation at complexity");
                        metric_local._4_4_ = uVar1;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                             ,0xb8c,"moving_fixed_point_metric",(ulong)uVar1,"local lp norm scaling"
                            );
                      metric_local._4_4_ = uVar1;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                           ,0xb8b,"moving_fixed_point_metric",(ulong)uVar1,
                           "floor metric eigenvalues based on grid size and solution jitter");
                    metric_local._4_4_ = uVar1;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return metric_local._4_4_;
}

Assistant:

static REF_STATUS moving_fixed_point_metric(
    REF_DBL *metric, REF_GRID ref_grid, REF_INT first_timestep,
    REF_INT last_timestep, REF_INT timestep_increment, const char *in_project,
    const char *solb_middle, REF_RECON_RECONSTRUCTION reconstruction, REF_INT p,
    REF_DBL gradation, REF_DBL complexity) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *hess, *scalar;
  REF_DBL *jac, *x, *grad, *this_metric, *xyz, det;
  REF_INT timestep, total_timesteps;
  char solb_filename[1024];
  REF_DBL inv_total;
  REF_INT im, node;
  REF_INT fixed_point_ldim;
  REF_DBL *displaced;
  REF_INT i, j;

  ref_malloc(hess, 6 * ref_node_max(ref_node), REF_DBL);
  ref_malloc(this_metric, 6 * ref_node_max(ref_node), REF_DBL);
  ref_malloc(jac, 9 * ref_node_max(ref_node), REF_DBL);
  ref_malloc(x, ref_node_max(ref_node), REF_DBL);
  ref_malloc(grad, 3 * ref_node_max(ref_node), REF_DBL);
  ref_malloc(xyz, 3 * ref_node_max(ref_node), REF_DBL);

  total_timesteps = 0;
  for (timestep = first_timestep; timestep <= last_timestep;
       timestep += timestep_increment) {
    snprintf(solb_filename, 1024, "%s%s%d.solb", in_project, solb_middle,
             timestep);
    if (ref_mpi_once(ref_mpi))
      printf("read and hess recon for %s\n", solb_filename);
    RSS(ref_part_scalar(ref_grid, &fixed_point_ldim, &scalar, solb_filename),
        "unable to load scalar");
    REIS(4, fixed_point_ldim, "expected x,y,z and one scalar");
    RSS(extract_displaced_xyz(ref_node, &fixed_point_ldim, &scalar, &displaced),
        "disp");
    if (ref_grid_twod(ref_grid)) {
      each_ref_node_valid_node(ref_node, node) {
        displaced[1 + 3 * node] = displaced[2 + 3 * node];
        displaced[2 + 3 * node] = 0.0;
      }
    }
    for (j = 0; j < 3; j++) {
      each_ref_node_valid_node(ref_node, node) {
        x[node] = displaced[j + 3 * node];
      }
      RSS(ref_recon_gradient(ref_grid, x, grad, reconstruction), "recon x");
      if (ref_grid_twod(ref_grid)) {
        each_ref_node_valid_node(ref_node, node) { grad[2 + 3 * node] = 1.0; }
      }
      each_ref_node_valid_node(ref_node, node) {
        for (i = 0; i < 3; i++) {
          jac[i + 3 * j + 9 * node] = grad[i + 3 * node];
        }
      }
    }

    each_ref_node_valid_node(ref_node, node) {
      for (i = 0; i < 3; i++) {
        xyz[i + 3 * node] = ref_node_xyz(ref_node, i, node);
        ref_node_xyz(ref_node, i, node) = displaced[i + 3 * node];
      }
    }
    RSS(ref_recon_hessian(ref_grid, scalar, hess, reconstruction), "hess");
    RSS(ref_recon_roundoff_limit(hess, ref_grid),
        "floor metric eigenvalues based on grid size and solution jitter");
    each_ref_node_valid_node(ref_node, node) {
      for (i = 0; i < 3; i++) {
        ref_node_xyz(ref_node, i, node) = xyz[i + 3 * node];
      }
    }

    each_ref_node_valid_node(ref_node, node) {
      RSS(ref_matrix_jac_m_jact(&(jac[9 * node]), &(hess[6 * node]),
                                &(this_metric[6 * node])),
          "J M J^t");

      RSS(ref_matrix_det_gen(3, &(jac[9 * node]), &det), "gen det");
      for (i = 0; i < 6; i++) {
        this_metric[i + 6 * node] *= pow(ABS(det), 1.0 / (REF_DBL)p);
      }
    }

    total_timesteps++;
    each_ref_node_valid_node(ref_node, node) {
      for (im = 0; im < 6; im++) {
        metric[im + 6 * node] += this_metric[im + 6 * node];
      }
    }

    ref_free(displaced);
    ref_free(scalar);
  }
  free(xyz);
  free(grad);
  free(x);
  free(jac);
  free(this_metric);
  free(hess);
  ref_mpi_stopwatch_stop(ref_mpi, "all timesteps processed");

  RAS(0 < total_timesteps, "expected one or more timesteps");
  inv_total = 1.0 / (REF_DBL)total_timesteps;
  each_ref_node_valid_node(ref_node, node) {
    for (im = 0; im < 6; im++) {
      metric[im + 6 * node] *= inv_total;
    }
  }
  RSS(ref_recon_roundoff_limit(metric, ref_grid),
      "floor metric eigenvalues based on grid size and solution jitter");
  RSS(ref_metric_local_scale(metric, ref_grid, p), "local lp norm scaling");
  ref_mpi_stopwatch_stop(ref_mpi, "local scale metric");
  RSS(ref_metric_gradation_at_complexity(metric, ref_grid, gradation,
                                         complexity),
      "gradation at complexity");
  ref_mpi_stopwatch_stop(ref_mpi, "metric gradation and complexity");
  return REF_SUCCESS;
}